

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O2

sink_ptr __thiscall
bidfx_public_api::tools::LoggerFactory::AddDailyFileLogger
          (LoggerFactory *this,string *base_filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  sink_ptr sVar2;
  int local_2c;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_2c = 0;
  std::
  make_shared<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::daily_filename_calculator>,std::__cxx11::string&,int,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (int *)base_filename,&local_2c);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)this = local_28._M_p;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  AddSink((sink_ptr *)this);
  sVar2.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sink_ptr)sVar2.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

spdlog::sink_ptr LoggerFactory::AddDailyFileLogger(std::string base_filename)
{
    spdlog::sink_ptr sink = std::make_shared<spdlog::sinks::daily_file_sink_mt>(base_filename, 0, 0);
    AddSink(sink);
    return sink;
}